

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O1

ssize_t __thiscall
anon_unknown.dwarf_33fb946::WriterSpy::write(WriterSpy *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  element_type *peVar2;
  uint uVar3;
  undefined4 in_register_00000034;
  string buf;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  uVar3 = (**(code **)((long)*(this->w).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 0x20))();
  if ((char)uVar3 != '\0') {
    pcVar1 = (this->prefix)._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->prefix)._M_string_length);
    std::__cxx11::string::replace
              ((ulong)&local_50,local_48,(char *)0x0,CONCAT44(in_register_00000034,__fd));
    peVar2 = (this->s).super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)((long)*peVar2 + 0x20))(peVar2,local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  }
  return (ulong)uVar3;
}

Assistant:

bool write(const void* buffer, size_t n) override {
    if (!w->write(buffer, n)) {
      return false;
    }
    auto chars = reinterpret_cast<const char*>(buffer);
    std::string buf = prefix;
    buf.append(chars, chars + n);
    s->write(buf.data(), buf.size());
    return true;
  }